

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

bool __thiscall
leveldb::FilterBlockReader::KeyMayMatch(FilterBlockReader *this,uint64_t block_offset,Slice *key)

{
  int iVar1;
  ulong uVar2;
  undefined1 local_48 [8];
  Slice filter;
  uint32_t limit;
  uint32_t start;
  uint64_t index;
  Slice *key_local;
  uint64_t block_offset_local;
  FilterBlockReader *this_local;
  
  uVar2 = block_offset >> ((byte)this->base_lg_ & 0x3f);
  if (uVar2 < this->num_) {
    filter.size_._4_4_ = DecodeFixed32(this->offset_ + uVar2 * 4);
    filter.size_._0_4_ = DecodeFixed32(this->offset_ + uVar2 * 4 + 4);
    if ((filter.size_._4_4_ <= (uint32_t)filter.size_) &&
       ((ulong)(uint32_t)filter.size_ <= (ulong)((long)this->offset_ - (long)this->data_))) {
      Slice::Slice((Slice *)local_48,this->data_ + filter.size_._4_4_,
                   (ulong)((uint32_t)filter.size_ - filter.size_._4_4_));
      iVar1 = (*this->policy_->_vptr_FilterPolicy[4])(this->policy_,key,local_48);
      return (bool)((byte)iVar1 & 1);
    }
    if (filter.size_._4_4_ == (uint32_t)filter.size_) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FilterBlockReader::KeyMayMatch(uint64_t block_offset, const Slice& key) {
  uint64_t index = block_offset >> base_lg_;
  if (index < num_) {
    uint32_t start = DecodeFixed32(offset_ + index * 4);
    uint32_t limit = DecodeFixed32(offset_ + index * 4 + 4);
    if (start <= limit && limit <= static_cast<size_t>(offset_ - data_)) {
      Slice filter = Slice(data_ + start, limit - start);
      return policy_->KeyMayMatch(key, filter);
    } else if (start == limit) {
      // Empty filters do not match any keys
      return false;
    }
  }
  return true;  // Errors are treated as potential matches
}